

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorShower::QColorShower(QColorShower *this,QColorDialog *parent)

{
  QAnyStringView *pQVar1;
  QRgb QVar2;
  QSpinBox *this_00;
  QWidget *pQVar3;
  Object *sender;
  void *pvVar4;
  QColorShower *this_01;
  QRegularExpressionValidator *this_02;
  QWidget *in_RSI;
  QObject *in_RDI;
  QColorShowLabel *this_03;
  long in_FS_OFFSET;
  QRegularExpressionValidator *validator;
  int s;
  char16_t *str;
  QRegularExpression regExp;
  undefined4 uVar5;
  Policy ver;
  Policy in_stack_fffffffffffffa6c;
  enum_type in_stack_fffffffffffffa70;
  enum_type in_stack_fffffffffffffa74;
  QWidget *parent_00;
  QWidget *in_stack_fffffffffffffa80;
  undefined8 in_stack_fffffffffffffa88;
  QFlagsStorage<Qt::WindowType> QVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  QWidget *in_stack_fffffffffffffaa8;
  QGridLayout *in_stack_fffffffffffffab0;
  code *widget;
  ContextType *in_stack_fffffffffffffab8;
  ContextType *context;
  Object *in_stack_fffffffffffffac0;
  offset_in_QColorShowLabel_to_subr in_stack_fffffffffffffae0;
  offset_in_QSpinBox_to_subr signal;
  ConnectionType in_stack_fffffffffffffb00;
  ConnectionType type;
  undefined8 in_stack_fffffffffffffb48;
  QFlagsStorage<Qt::AlignmentFlag> QVar9;
  Connection local_1a0;
  code *local_198;
  undefined8 local_190;
  Connection local_188;
  code *local_180;
  undefined8 local_178;
  Connection local_170;
  code *local_168;
  undefined8 local_160;
  Connection local_158;
  code *local_150;
  undefined8 local_148;
  Connection local_140;
  code *local_138;
  undefined8 local_130;
  Connection local_128;
  code *local_120;
  undefined8 local_118;
  Connection local_110;
  code *local_108;
  undefined8 local_100;
  Connection local_f8;
  undefined4 local_ec;
  undefined4 local_e8;
  uint local_e4;
  QArrayDataPointer<char16_t> local_e0;
  undefined1 local_c8 [24];
  undefined1 *local_b0 [3];
  undefined4 local_98;
  undefined4 local_94;
  Policy local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  code *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  undefined8 local_20;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  QVar9.i = (Int)((ulong)in_stack_fffffffffffffb48 >> 0x20);
  QVar6.i = (Int)((ulong)in_stack_fffffffffffffa88 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0;
  parent_00 = in_RSI;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x734411);
  QWidget::QWidget(in_stack_fffffffffffffa80,parent_00,(WindowFlags)QVar6.i);
  *(undefined ***)in_RDI = &PTR_metaObject_00d20cf0;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QColorShower_00d20ea0;
  this_03 = (QColorShowLabel *)(in_RDI + 0x38);
  QColor::QColor((QColor *)0x734455);
  *(QWidget **)(in_RDI + 0xd8) = in_RSI;
  QVar2 = qRgb(0xff,0xff,0xff);
  *(QRgb *)(in_RDI + 0x34) = QVar2;
  QColor::operator=((QColor *)this_03,white);
  this_00 = (QSpinBox *)operator_new(0x20);
  QGridLayout::QGridLayout((QGridLayout *)this_03,parent_00);
  *(QSpinBox **)(in_RDI + 0xe0) = this_00;
  (**(code **)(**(long **)(in_RDI + 0xe0) + 0x60))();
  QLayout::setContentsMargins
            ((QLayout *)this_03,(int)((ulong)parent_00 >> 0x20),(int)parent_00,
             in_stack_fffffffffffffa74,in_stack_fffffffffffffa70);
  pQVar3 = (QWidget *)operator_new(0x48);
  QColorShowLabel::QColorShowLabel(this_03,parent_00);
  *(QWidget **)(in_RDI + 200) = pQVar3;
  QWidget::setMinimumWidth(pQVar3,(int)((ulong)this_00 >> 0x20));
  uVar8 = *(undefined8 *)(in_RDI + 200);
  uVar7 = *(undefined8 *)(in_RDI + 0xe0);
  local_10 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x73458a);
  QGridLayout::addWidget
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,(int)((ulong)uVar8 >> 0x20),
             (int)uVar8,(int)((ulong)uVar7 >> 0x20),(int)uVar7,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
             SUB84((ulong)in_stack_fffffffffffffab8 >> 0x20,0));
  local_30._8_8_ = newCol;
  local_20._0_1_ = (QPaintDevice)0x0;
  local_20._1_7_ = 0;
  widget = QColorShowLabel::colorDropped;
  pQVar3 = (QWidget *)&stack0xffffffffffffffe8;
  QObject::
  connect<void(QtPrivate::QColorShowLabel::*)(unsigned_int),void(QtPrivate::QColorShower::*)(unsigned_int)>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffae0,in_stack_fffffffffffffab8,
             (offset_in_QColorShower_to_subr *)QColorShowLabel::colorDropped,
             in_stack_fffffffffffffb00);
  QMetaObject::Connection::~Connection((Connection *)pQVar3);
  local_40 = setRgb;
  local_38 = 0;
  uVar5 = 0;
  context = (ContextType *)local_30;
  QObject::
  connect<void(QtPrivate::QColorShowLabel::*)(unsigned_int),void(QtPrivate::QColorShower::*)(unsigned_int)>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffae0,context,
             (offset_in_QColorShower_to_subr *)widget,in_stack_fffffffffffffb00);
  QMetaObject::Connection::~Connection((Connection *)context);
  sender = (Object *)operator_new(0x28);
  QColSpinBox::QColSpinBox
            ((QColSpinBox *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (QWidget *)CONCAT44(in_stack_fffffffffffffa6c,uVar5));
  *(Object **)(in_RDI + 0x80) = sender;
  QSpinBox::setRange(this_00,(int)((ulong)this_03 >> 0x20),(int)this_03);
  QVar6.i = (Int)((ulong)this_00 >> 0x20);
  pvVar4 = operator_new(0x28);
  local_44 = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x734748);
  QLabel::QLabel((QLabel *)this_03,parent_00,(WindowFlags)QVar6.i);
  *(void **)(in_RDI + 0x48) = pvVar4;
  QLabel::setBuddy((QLabel *)sender,&context->super_QWidget);
  Qt::operator|(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70);
  QLabel::setAlignment
            ((QLabel *)this_03,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)uVar7 >> 0x20,0));
  signal = *(offset_in_QSpinBox_to_subr *)(in_RDI + 0x48);
  local_48 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7347fd);
  QGridLayout::addWidget
            ((QGridLayout *)context,(QWidget *)widget,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3,
             (Alignment)QVar9.i);
  local_4c = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x734860);
  QGridLayout::addWidget
            ((QGridLayout *)context,(QWidget *)widget,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3,
             (Alignment)QVar9.i);
  this_01 = (QColorShower *)operator_new(0x28);
  QColSpinBox::QColSpinBox
            ((QColSpinBox *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (QWidget *)CONCAT44(in_stack_fffffffffffffa6c,uVar5));
  *(QColorShower **)(in_RDI + 0x88) = this_01;
  pvVar4 = operator_new(0x28);
  local_50 = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x7348f4);
  QLabel::QLabel((QLabel *)this_03,parent_00,(WindowFlags)QVar6.i);
  *(void **)(in_RDI + 0x50) = pvVar4;
  QLabel::setBuddy((QLabel *)sender,&context->super_QWidget);
  type = (ConnectionType)pvVar4;
  Qt::operator|(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70);
  QLabel::setAlignment
            ((QLabel *)this_03,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)uVar7 >> 0x20,0));
  local_54 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7349b1);
  QGridLayout::addWidget
            ((QGridLayout *)context,(QWidget *)widget,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3,
             (Alignment)QVar9.i);
  local_58 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x734a15);
  QGridLayout::addWidget
            ((QGridLayout *)context,(QWidget *)widget,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3,
             (Alignment)QVar9.i);
  pvVar4 = operator_new(0x28);
  QColSpinBox::QColSpinBox
            ((QColSpinBox *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (QWidget *)CONCAT44(in_stack_fffffffffffffa6c,uVar5));
  *(void **)(in_RDI + 0x90) = pvVar4;
  pvVar4 = operator_new(0x28);
  local_5c = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x734aa9);
  QLabel::QLabel((QLabel *)this_03,parent_00,(WindowFlags)QVar6.i);
  *(void **)(in_RDI + 0x58) = pvVar4;
  QLabel::setBuddy((QLabel *)sender,&context->super_QWidget);
  Qt::operator|(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70);
  QLabel::setAlignment
            ((QLabel *)this_03,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)uVar7 >> 0x20,0));
  QVar9.i = (Int)((ulong)*(undefined8 *)(in_RDI + 0xe0) >> 0x20);
  local_60 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x734b66);
  QGridLayout::addWidget
            ((QGridLayout *)context,(QWidget *)widget,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3,
             (Alignment)QVar9.i);
  local_64 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x734bcf);
  QGridLayout::addWidget
            ((QGridLayout *)context,(QWidget *)widget,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3,
             (Alignment)QVar9.i);
  pvVar4 = operator_new(0x28);
  QColSpinBox::QColSpinBox
            ((QColSpinBox *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (QWidget *)CONCAT44(in_stack_fffffffffffffa6c,uVar5));
  *(void **)(in_RDI + 0x98) = pvVar4;
  pvVar4 = operator_new(0x28);
  local_68 = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x734c5e);
  QLabel::QLabel((QLabel *)this_03,parent_00,(WindowFlags)QVar6.i);
  *(void **)(in_RDI + 0x60) = pvVar4;
  QLabel::setBuddy((QLabel *)sender,&context->super_QWidget);
  Qt::operator|(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70);
  QLabel::setAlignment
            ((QLabel *)this_03,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)uVar7 >> 0x20,0));
  local_6c = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x734d1b);
  QGridLayout::addWidget
            ((QGridLayout *)context,(QWidget *)widget,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3,
             (Alignment)QVar9.i);
  local_70 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x734d84);
  QGridLayout::addWidget
            ((QGridLayout *)context,(QWidget *)widget,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3,
             (Alignment)QVar9.i);
  pvVar4 = operator_new(0x28);
  QColSpinBox::QColSpinBox
            ((QColSpinBox *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (QWidget *)CONCAT44(in_stack_fffffffffffffa6c,uVar5));
  *(void **)(in_RDI + 0xa0) = pvVar4;
  pvVar4 = operator_new(0x28);
  local_74 = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x734e1d);
  QLabel::QLabel((QLabel *)this_03,parent_00,(WindowFlags)QVar6.i);
  *(void **)(in_RDI + 0x68) = pvVar4;
  QLabel::setBuddy((QLabel *)sender,&context->super_QWidget);
  Qt::operator|(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70);
  QLabel::setAlignment
            ((QLabel *)this_03,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)uVar7 >> 0x20,0));
  local_78 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x734eda);
  QGridLayout::addWidget
            ((QGridLayout *)context,(QWidget *)widget,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3,
             (Alignment)QVar9.i);
  local_7c = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x734f43);
  QGridLayout::addWidget
            ((QGridLayout *)context,(QWidget *)widget,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3,
             (Alignment)QVar9.i);
  pvVar4 = operator_new(0x28);
  QColSpinBox::QColSpinBox
            ((QColSpinBox *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (QWidget *)CONCAT44(in_stack_fffffffffffffa6c,uVar5));
  *(void **)(in_RDI + 0xa8) = pvVar4;
  pvVar4 = operator_new(0x28);
  local_80 = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x734fd7);
  QLabel::QLabel((QLabel *)this_03,parent_00,(WindowFlags)QVar6.i);
  *(void **)(in_RDI + 0x70) = pvVar4;
  QLabel::setBuddy((QLabel *)sender,&context->super_QWidget);
  Qt::operator|(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70);
  QLabel::setAlignment
            ((QLabel *)this_03,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)uVar7 >> 0x20,0));
  local_84 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x735094);
  QGridLayout::addWidget
            ((QGridLayout *)context,(QWidget *)widget,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3,
             (Alignment)QVar9.i);
  local_88 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7350fd);
  QGridLayout::addWidget
            ((QGridLayout *)context,(QWidget *)widget,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3,
             (Alignment)QVar9.i);
  pvVar4 = operator_new(0x28);
  QColSpinBox::QColSpinBox
            ((QColSpinBox *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (QWidget *)CONCAT44(in_stack_fffffffffffffa6c,uVar5));
  *(void **)(in_RDI + 0xb0) = pvVar4;
  pvVar4 = operator_new(0x28);
  local_8c = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x735191);
  QLabel::QLabel((QLabel *)this_03,parent_00,(WindowFlags)QVar6.i);
  *(void **)(in_RDI + 0xb8) = pvVar4;
  QLabel::setBuddy((QLabel *)sender,&context->super_QWidget);
  Qt::operator|(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70);
  QLabel::setAlignment
            ((QLabel *)this_03,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)uVar7 >> 0x20,0));
  local_90 = Fixed;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x73525a);
  ver = local_90;
  QGridLayout::addWidget
            ((QGridLayout *)widget,pQVar3,(int)((ulong)uVar8 >> 0x20),(int)uVar8,
             (int)((ulong)uVar7 >> 0x20),(int)uVar7,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)context >> 0x20,0));
  local_94 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7352cf);
  QGridLayout::addWidget
            ((QGridLayout *)context,(QWidget *)widget,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3,
             (Alignment)QVar9.i);
  QWidget::hide((QWidget *)0x73530e);
  QWidget::hide((QWidget *)0x735322);
  pvVar4 = operator_new(0x28);
  local_98 = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x73534f);
  QLabel::QLabel((QLabel *)this_03,parent_00,(WindowFlags)QVar6.i);
  *(void **)(in_RDI + 0x78) = pvVar4;
  pvVar4 = operator_new(0x28);
  QLineEdit::QLineEdit((QLineEdit *)this_03,parent_00);
  *(void **)(in_RDI + 0xc0) = pvVar4;
  pQVar1 = *(QAnyStringView **)(in_RDI + 0xc0);
  std::data<char_const,22ul>((char (*) [22])"qt_colorname_lineedit");
  lengthHelperContainer<char,22ul>((char (*) [22])0x73541b);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent_00,
             CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  QObject::setObjectName(pQVar1);
  QLabel::setBuddy((QLabel *)sender,&context->super_QWidget);
  local_b0[0] = &DAT_aaaaaaaaaaaaaaaa;
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (&local_e0,(Data *)0x0,L"#?([A-Fa-f0-9]{6}|[A-Fa-f0-9]{3})",0x21);
  QString::QString((QString *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffffa6c,ver));
  QFlags<QRegularExpression::PatternOption>::QFlags
            ((QFlags<QRegularExpression::PatternOption> *)
             CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),in_stack_fffffffffffffa6c
            );
  QRegularExpression::QRegularExpression
            ((QRegularExpression *)local_b0,(QString *)local_c8,(QFlags_conflict1 *)(ulong)local_e4)
  ;
  QString::~QString((QString *)0x73552e);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  this_02 = (QRegularExpressionValidator *)operator_new(0x10);
  QRegularExpressionValidator::QRegularExpressionValidator
            (this_02,(QRegularExpression *)local_b0,in_RDI);
  QLineEdit::setValidator
            ((QLineEdit *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (QValidator *)CONCAT44(in_stack_fffffffffffffa6c,ver));
  QWidget::setSizePolicy
            ((QWidget *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             in_stack_fffffffffffffa6c,ver);
  Qt::operator|(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70);
  QLabel::setAlignment
            ((QLabel *)this_03,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)uVar7 >> 0x20,0));
  local_e8 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x735630);
  QGridLayout::addWidget
            ((QGridLayout *)context,(QWidget *)widget,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3,
             (Alignment)QVar9.i);
  local_ec = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x73569e);
  QGridLayout::addWidget
            ((QGridLayout *)widget,pQVar3,(int)((ulong)uVar8 >> 0x20),(int)uVar8,
             (int)((ulong)uVar7 >> 0x20),(int)uVar7,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)context >> 0x20,0));
  local_108 = hsvEd;
  local_100 = 0;
  QObject::connect<void(QSpinBox::*)(int),void(QtPrivate::QColorShower::*)()>
            (sender,signal,context,(offset_in_QColorShower_to_subr *)widget,type);
  QMetaObject::Connection::~Connection(&local_f8);
  local_120 = hsvEd;
  local_118 = 0;
  QObject::connect<void(QSpinBox::*)(int),void(QtPrivate::QColorShower::*)()>
            (sender,signal,context,(offset_in_QColorShower_to_subr *)widget,type);
  QMetaObject::Connection::~Connection(&local_110);
  local_138 = hsvEd;
  local_130 = 0;
  QObject::connect<void(QSpinBox::*)(int),void(QtPrivate::QColorShower::*)()>
            (sender,signal,context,(offset_in_QColorShower_to_subr *)widget,type);
  QMetaObject::Connection::~Connection(&local_128);
  local_150 = rgbEd;
  local_148 = 0;
  QObject::connect<void(QSpinBox::*)(int),void(QtPrivate::QColorShower::*)()>
            (sender,signal,context,(offset_in_QColorShower_to_subr *)widget,type);
  QMetaObject::Connection::~Connection(&local_140);
  local_168 = rgbEd;
  local_160 = 0;
  QObject::connect<void(QSpinBox::*)(int),void(QtPrivate::QColorShower::*)()>
            (sender,signal,context,(offset_in_QColorShower_to_subr *)widget,type);
  QMetaObject::Connection::~Connection(&local_158);
  local_180 = rgbEd;
  local_178 = 0;
  QObject::connect<void(QSpinBox::*)(int),void(QtPrivate::QColorShower::*)()>
            (sender,signal,context,(offset_in_QColorShower_to_subr *)widget,type);
  QMetaObject::Connection::~Connection(&local_170);
  local_198 = rgbEd;
  local_190 = 0;
  QObject::connect<void(QSpinBox::*)(int),void(QtPrivate::QColorShower::*)()>
            (sender,signal,context,(offset_in_QColorShower_to_subr *)widget,type);
  QMetaObject::Connection::~Connection(&local_188);
  QObject::connect<void(QLineEdit::*)(QString_const&),void(QtPrivate::QColorShower::*)()>
            ((Object *)sender,signal,context,(offset_in_QColorShower_to_subr *)widget,type);
  QMetaObject::Connection::~Connection(&local_1a0);
  retranslateStrings(this_01);
  QRegularExpression::~QRegularExpression((QRegularExpression *)local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QColorShower::QColorShower(QColorDialog *parent)
    : QWidget(parent)
{
    colorDialog = parent;

    curCol = qRgb(255, 255, 255);
    curQColor = Qt::white;

    gl = new QGridLayout(this);
    const int s = gl->spacing();
    gl->setContentsMargins(s, s, s, s);
    lab = new QColorShowLabel(this);

#ifdef QT_SMALL_COLORDIALOG
    lab->setMinimumHeight(60);
#endif
    lab->setMinimumWidth(60);

// For QVGA screens only the comboboxes and color label are visible.
// For nHD screens only color and luminence pickers and color label are visible.
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lab, 0, 0, -1, 1);
#else
    gl->addWidget(lab, 0, 0, 1, -1);
#endif
    connect(lab, &QColorShowLabel::colorDropped, this, &QColorShower::newCol);
    connect(lab, &QColorShowLabel::colorDropped, this, &QColorShower::setRgb);

    hEd = new QColSpinBox(this);
    hEd->setRange(0, 359);
    lblHue = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblHue->setBuddy(hEd);
#endif
    lblHue->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblHue, 0, 1);
    gl->addWidget(hEd, 0, 2);
#else
    gl->addWidget(lblHue, 1, 0);
    gl->addWidget(hEd, 2, 0);
#endif

    sEd = new QColSpinBox(this);
    lblSat = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblSat->setBuddy(sEd);
#endif
    lblSat->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblSat, 1, 1);
    gl->addWidget(sEd, 1, 2);
#else
    gl->addWidget(lblSat, 1, 1);
    gl->addWidget(sEd, 2, 1);
#endif

    vEd = new QColSpinBox(this);
    lblVal = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblVal->setBuddy(vEd);
#endif
    lblVal->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblVal, 2, 1);
    gl->addWidget(vEd, 2, 2);
#else
    gl->addWidget(lblVal, 1, 2);
    gl->addWidget(vEd, 2, 2);
#endif

    rEd = new QColSpinBox(this);
    lblRed = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblRed->setBuddy(rEd);
#endif
    lblRed->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblRed, 0, 3);
    gl->addWidget(rEd, 0, 4);
#else
    gl->addWidget(lblRed, 3, 0);
    gl->addWidget(rEd, 4, 0);
#endif

    gEd = new QColSpinBox(this);
    lblGreen = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblGreen->setBuddy(gEd);
#endif
    lblGreen->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblGreen, 1, 3);
    gl->addWidget(gEd, 1, 4);
#else
    gl->addWidget(lblGreen, 3, 1);
    gl->addWidget(gEd, 4, 1);
#endif

    bEd = new QColSpinBox(this);
    lblBlue = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblBlue->setBuddy(bEd);
#endif
    lblBlue->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblBlue, 2, 3);
    gl->addWidget(bEd, 2, 4);
#else
    gl->addWidget(lblBlue, 3, 2);
    gl->addWidget(bEd, 4, 2);
#endif

    alphaEd = new QColSpinBox(this);
    alphaLab = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    alphaLab->setBuddy(alphaEd);
#endif
    alphaLab->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(alphaLab, 3, 1, 1, 3);
    gl->addWidget(alphaEd, 3, 4);
#else
    gl->addWidget(alphaLab, 1, 3, 3, 1);
    gl->addWidget(alphaEd, 4, 3);
#endif
    alphaEd->hide();
    alphaLab->hide();
    lblHtml = new QLabel(this);
    htEd = new QLineEdit(this);
    htEd->setObjectName("qt_colorname_lineedit");
#ifndef QT_NO_SHORTCUT
    lblHtml->setBuddy(htEd);
#endif

#if QT_CONFIG(regularexpression)
    QRegularExpression regExp(QStringLiteral("#?([A-Fa-f0-9]{6}|[A-Fa-f0-9]{3})"));
    QRegularExpressionValidator *validator = new QRegularExpressionValidator(regExp, this);
    htEd->setValidator(validator);
#else
    htEd->setReadOnly(true);
#endif
    htEd->setSizePolicy(QSizePolicy::Maximum, QSizePolicy::Fixed);

    lblHtml->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblHtml, 5, 0);
    gl->addWidget(htEd, 5, 1, 1, /*colspan=*/ 2);
#else
    gl->addWidget(lblHtml, 5, 1);
    gl->addWidget(htEd, 5, 2, 1, /*colspan=*/ 3);
#endif

    connect(hEd, &QSpinBox::valueChanged, this, &QColorShower::hsvEd);
    connect(sEd, &QSpinBox::valueChanged, this, &QColorShower::hsvEd);
    connect(vEd, &QSpinBox::valueChanged, this, &QColorShower::hsvEd);

    connect(rEd, &QSpinBox::valueChanged, this, &QColorShower::rgbEd);
    connect(gEd, &QSpinBox::valueChanged, this, &QColorShower::rgbEd);
    connect(bEd, &QSpinBox::valueChanged, this, &QColorShower::rgbEd);
    connect(alphaEd, &QSpinBox::valueChanged, this, &QColorShower::rgbEd);
    connect(htEd, &QLineEdit::textEdited, this, &QColorShower::htmlEd);

    retranslateStrings();
}